

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<float_*,_10>::TPZManVector(TPZManVector<float_*,_10> *this,int64_t size,float **copy)

{
  float **ppfVar1;
  long lVar2;
  int64_t iVar3;
  
  TPZVec<float_*>::TPZVec(&this->super_TPZVec<float_*>,0);
  (this->super_TPZVec<float_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841c60;
  if (size < 0xb) {
    ppfVar1 = this->fExtAlloc;
    iVar3 = 0;
  }
  else {
    ppfVar1 = (float **)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
    iVar3 = size;
  }
  (this->super_TPZVec<float_*>).fStore = ppfVar1;
  (this->super_TPZVec<float_*>).fNElements = size;
  (this->super_TPZVec<float_*>).fNAlloc = iVar3;
  if (0 < size) {
    lVar2 = 0;
    do {
      (this->super_TPZVec<float_*>).fStore[lVar2] = *copy;
      lVar2 = lVar2 + 1;
    } while (size != lVar2);
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}